

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::tryFixupInstances
          (Scope *this,DataDeclarationSyntax *syntax,ASTContext *context,
          SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  SyntaxNode *this_00;
  DefinitionSymbol *pDVar1;
  Symbol *pSVar2;
  InstanceBodySymbol *this_01;
  Scope *in_RDI;
  DefinitionSymbol *defSym;
  Symbol *def;
  string_view name;
  NamedTypeSyntax *namedType;
  Scope *in_stack_000001b8;
  Compilation *in_stack_000001c0;
  undefined1 in_stack_000001c8 [16];
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_000002b0;
  ASTContext *in_stack_000002b8;
  DataDeclarationSyntax *in_stack_000002c0;
  DefinitionSymbol *in_stack_000002c8;
  Compilation *in_stack_000002d0;
  int *local_58;
  
  this_00 = (SyntaxNode *)
            not_null<slang::syntax::DataTypeSyntax_*>::operator->
                      ((not_null<slang::syntax::DataTypeSyntax_*> *)0x49c8e2);
  slang::syntax::SyntaxNode::as<slang::syntax::NamedTypeSyntax>(this_00);
  getIdentifierName((NamedTypeSyntax *)0x49c8f9);
  Compilation::tryGetDefinition(in_stack_000001c0,(string_view)in_stack_000001c8,in_stack_000001b8);
  if ((local_58 != (int *)0x0) && (*local_58 == 2)) {
    pDVar1 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x49c95a);
    if ((pDVar1->definitionKind == Interface) &&
       (pSVar2 = asSymbol(in_RDI), pSVar2->kind == InstanceBody)) {
      asSymbol(in_RDI);
      this_01 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x49c989);
      pDVar1 = InstanceBodySymbol::getDefinition(this_01);
      if ((pDVar1->hasNonAnsiPorts & 1U) != 0) {
        return;
      }
    }
    InstanceSymbol::fromFixupSyntax
              (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
               in_stack_000002b0);
  }
  return;
}

Assistant:

void Scope::tryFixupInstances(const DataDeclarationSyntax& syntax, const ASTContext& context,
                              SmallVectorBase<const Symbol*>& results) const {
    auto& namedType = syntax.type->as<NamedTypeSyntax>();
    std::string_view name = getIdentifierName(namedType);
    auto def = compilation.tryGetDefinition(name, *this).definition;
    if (!def || def->kind != SymbolKind::Definition)
        return;

    // Matching the check in handleDataDeclaration -- if this is true we
    // handle this as a non-ansi interface port declaration instead.
    auto& defSym = def->as<DefinitionSymbol>();
    if (defSym.definitionKind == DefinitionKind::Interface &&
        asSymbol().kind == SymbolKind::InstanceBody &&
        asSymbol().as<InstanceBodySymbol>().getDefinition().hasNonAnsiPorts) {
        return;
    }

    // Assume this is malformed instantiation syntax and create the instances anyway.
    InstanceSymbol::fromFixupSyntax(compilation, defSym, syntax, context, results);
}